

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerTrapIfZero(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  int64 iVar5;
  Opnd *pOVar6;
  LabelInstr *target;
  Opnd *compareSrc2;
  Lowerer *this_01;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a34,"(instr)","instr");
    if (!bVar2) goto LAB_005a71f4;
    *puVar4 = 0;
  }
  if (instr->m_opcode != TrapIfZero) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a35,"(instr->m_opcode == Js::OpCode::TrapIfZero)",
                       "instr->m_opcode == Js::OpCode::TrapIfZero");
    if (!bVar2) goto LAB_005a71f4;
    *puVar4 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a36,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_005a71f4;
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a37,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar2) {
LAB_005a71f4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pOVar6 = instr->m_src1;
  OVar3 = IR::Opnd::GetKind(pOVar6);
  if (OVar3 == OpndKindIntConst) {
LAB_005a714f:
    iVar5 = IR::Opnd::GetImmediateValue(pOVar6,this->m_func);
    if (iVar5 != 0) goto LAB_005a717f;
    pOVar6 = IR::IntConstOpnd::NewFromType(0x1b62,TyInt32,this->m_func);
    target = (LabelInstr *)instr;
  }
  else {
    OVar3 = IR::Opnd::GetKind(pOVar6);
    if (OVar3 == OpndKindInt64Const) goto LAB_005a714f;
    OVar3 = IR::Opnd::GetKind(pOVar6);
    if (OVar3 == OpndKindAddr) goto LAB_005a714f;
    OVar3 = IR::Opnd::GetKind(pOVar6);
    if (OVar3 == OpndKindHelperCall) goto LAB_005a714f;
    target = InsertLabel(false,instr->m_next);
    this_01 = (Lowerer *)0x0;
    compareSrc2 = IR::IntConstOpnd::NewFromType(0,pOVar6->m_type,this->m_func);
    InsertCompareBranch(this_01,pOVar6,compareSrc2,BrNeq_A,false,target,&target->super_Instr,false);
    InsertLabel(true,&target->super_Instr);
    pOVar6 = IR::IntConstOpnd::NewFromType(0x1b62,TyInt32,this->m_func);
  }
  GenerateThrow(this,pOVar6,&target->super_Instr);
LAB_005a717f:
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void
Lowerer::LowerTrapIfZero(IR::Instr * const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::TrapIfZero);
    Assert(instr->GetSrc1());
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());

    IR::Opnd * src1 = instr->GetSrc1();
    if (src1->IsImmediateOpnd())
    {
        if (src1->GetImmediateValue(m_func) == 0)
        {
            GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_DivideByZero), TyInt32, m_func), instr);
        }
    }
    else
    {
        IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
        InsertCompareBranch(src1, IR::IntConstOpnd::NewFromType(0, src1->GetType(), m_func), Js::OpCode::BrNeq_A, doneLabel, doneLabel);
        InsertLabel(true, doneLabel);
        GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_DivideByZero), TyInt32, m_func), doneLabel);
    }
    LowererMD::ChangeToAssign(instr);
}